

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O3

size_t maxColumnWidth(FILE *fp)

{
  int iVar1;
  size_t sVar2;
  winsize ws;
  undefined8 local_10;
  
  if (fp == (FILE *)0x0) {
    fp = (FILE *)_stdout;
  }
  iVar1 = fileno((FILE *)fp);
  local_10 = 0;
  sVar2 = 0x4f;
  if (-1 < iVar1) {
    iVar1 = ioctl(iVar1,0x5413,&local_10);
    if (iVar1 == 0) {
      sVar2 = 0x4f;
      if ((ushort)(local_10._2_2_ - 0x50) < 0xb0) {
        sVar2 = (ulong)local_10._2_2_ - 1;
      }
    }
  }
  return sVar2;
}

Assistant:

static size_t maxColumnWidth(FILE *fp)
{   
    size_t maxcols = _POPTHELP_MAXLINE;
#if defined(TIOCGWINSZ)
    struct winsize ws;
    int fdno = fileno(fp ? fp : stdout);

    memset(&ws, 0, sizeof(ws));
    if (fdno >= 0 && !ioctl(fdno, (unsigned long)TIOCGWINSZ, &ws)) {
	size_t ws_col = (size_t)ws.ws_col;
	if (ws_col > maxcols && ws_col < (size_t)256)
	    maxcols = ws_col - 1;
    }
#endif
    return maxcols;
}